

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

essentials_t * opengv::relative_pose::fivept_nister(RelativeAdapterBase *adapter,Indices *indices)

{
  long *plVar1;
  int iVar2;
  Scalar *pSVar3;
  Indices *in_RDX;
  long *in_RSI;
  essentials_t *in_RDI;
  Matrix<double,_9,_4,_0,_9,_4> EE;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  Matrix<double,_1,_9,_1,_1,_9> row;
  bearingVector_t fprime;
  bearingVector_t f;
  size_t i;
  MatrixXd Q;
  size_t numberCorrespondences;
  essentials_t *essentials;
  essentials_t *in_stack_00003158;
  Matrix<double,_9,_4,_0,_9,_4> *in_stack_00003160;
  DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  int in_stack_fffffffffffff98c;
  Indices *in_stack_fffffffffffff990;
  CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *in_stack_fffffffffffff998;
  unsigned_long *in_stack_fffffffffffff9a0;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff9a8;
  Scalar *in_stack_fffffffffffff9b0;
  CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *in_stack_fffffffffffff9b8;
  MatrixType *in_stack_fffffffffffff9c0;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffff9c8;
  undefined1 local_b8 [40];
  undefined1 local_90 [24];
  ulong local_78;
  undefined4 local_6c;
  size_t local_50;
  long *local_40;
  
  local_40 = in_RSI;
  local_50 = Indices::size(in_RDX);
  local_6c = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998);
  for (local_78 = 0; plVar1 = local_40, local_78 < local_50; local_78 = local_78 + 1) {
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,in_stack_fffffffffffff98c);
    (**(code **)(*plVar1 + 0x18))(local_90,plVar1,(long)iVar2);
    plVar1 = local_40;
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,in_stack_fffffffffffff98c);
    (**(code **)(*plVar1 + 0x10))(local_b8,plVar1,(long)iVar2);
    Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0xb8ac7a);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator<<
              ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)in_stack_fffffffffffff990,
               (Scalar *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                        (Index)in_stack_fffffffffffff980);
    in_stack_fffffffffffff9c0 = (MatrixType *)*pSVar3;
    in_stack_fffffffffffff9c8 =
         (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                   ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                    (Index)in_stack_fffffffffffff980);
    in_stack_fffffffffffff9b8 =
         Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
                   (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    in_stack_fffffffffffff9b0 =
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                   ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                    (Index)in_stack_fffffffffffff980);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (Index)in_stack_fffffffffffff980);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::operator_
              (in_stack_fffffffffffff998,(Scalar *)in_stack_fffffffffffff990);
    Eigen::CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)0xb8b131);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff998,
               (Index)in_stack_fffffffffffff990);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               in_stack_fffffffffffff980);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
             (uint)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff9c8,
             (Index)in_stack_fffffffffffff9c0,(Index)in_stack_fffffffffffff9b8,
             (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),(int)in_stack_fffffffffffff9b0);
  Eigen::Matrix<double,9,4,0,9,4>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
            ((Matrix<double,_9,_4,_0,_9,_4> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
              *)in_stack_fffffffffffff980);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb8b246);
  modules::fivept_nister_main(in_stack_00003160,in_stack_00003158);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb8b2d3);
  return in_RDI;
}

Assistant:

essentials_t fivept_nister(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 4);

  Eigen::MatrixXd Q(numberCorrespondences,9);
  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    //bearingVector_t f = adapter.getBearingVector1(indices[i]);
    //bearingVector_t fprime = adapter.getBearingVector2(indices[i]);
    //Nister's algorithm is computing the inverse transformation, so we simply
    //invert the input here
    bearingVector_t f = adapter.getBearingVector2(indices[i]);
    bearingVector_t fprime = adapter.getBearingVector1(indices[i]);
    Eigen::Matrix<double,1,9> row;
    row <<  f[0]*fprime[0], f[1]*fprime[0], f[2]*fprime[0],
        f[0]*fprime[1], f[1]*fprime[1], f[2]*fprime[1],
        f[0]*fprime[2], f[1]*fprime[2], f[2]*fprime[2];
    Q.row(i) = row;
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(Q, Eigen::ComputeFullV );
  Eigen::Matrix<double,9,4> EE = SVD.matrixV().block(0,5,9,4);
  essentials_t essentials;
  modules::fivept_nister_main(EE,essentials);

  return essentials;
}